

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cc
# Opt level: O0

bool __thiscall lexical::analyse_annotation(lexical *this,iterator *it,Meta *m)

{
  bool bVar1;
  reference pcVar2;
  Symbol local_e0;
  undefined1 local_b8 [8];
  Token t;
  string local_80;
  undefined1 local_50 [8];
  string buf;
  int state;
  Meta *m_local;
  iterator *it_local;
  lexical *this_local;
  
  buf.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)local_50);
  do {
    bVar1 = __gnu_cxx::operator!=(it,&m->end);
    if (!bVar1) {
      this_local._7_1_ = false;
      t.name.field_2._8_4_ = 1;
LAB_00121047:
      std::__cxx11::string::~string((string *)local_50);
      return this_local._7_1_;
    }
    switch(buf.field_2._12_4_) {
    case 0:
      buf.field_2._12_4_ = 1;
      break;
    case 1:
      pcVar2 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(it);
      bVar1 = sutil::is_key(pcVar2,true);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_80,anon_var_dwarf_20afe,
                   (allocator *)(t.name.field_2._M_local_buf + 0xf));
        error(this,it,m,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        std::allocator<char>::~allocator((allocator<char> *)(t.name.field_2._M_local_buf + 0xf));
        this_local._7_1_ = false;
        t.name.field_2._8_4_ = 1;
        goto LAB_00121047;
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator--(it);
      buf.field_2._12_4_ = 2;
      break;
    case 2:
      pcVar2 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(it);
      bVar1 = sutil::is_key(pcVar2,false);
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(it);
        std::__cxx11::string::push_back((char)local_50);
      }
      else {
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator--(it);
        buf.field_2._12_4_ = 3;
      }
      break;
    case 3:
      Token::Token((Token *)local_b8,m->line,m->column,8,(string *)local_50);
      std::vector<Token,_std::allocator<Token>_>::push_back(&this->tokens,(value_type *)local_b8);
      Symbol::Symbol(&local_e0,t.row,(string *)&t.type);
      std::set<Symbol,_std::less<Symbol>,_std::allocator<Symbol>_>::insert(&this->symbols,&local_e0)
      ;
      Symbol::~Symbol(&local_e0);
      this_local._7_1_ = true;
      t.name.field_2._8_4_ = 1;
      Token::~Token((Token *)local_b8);
      goto LAB_00121047;
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(it);
  } while( true );
}

Assistant:

bool lexical::analyse_annotation(string::iterator &it, const Meta &m) {
    int state = 0;
    string buf;
    while (it != m.end) {
        switch (state) {
            case 0: {
                state = 1;
                break;
            }
            case 1: {
                if (!sutil::is_key(*it, true)){
                    error(it, m, "注解的不能以非字母开头");
                    return false;
                }
                --it;
                state = 2;
                break;
            }
            case 2: {
                if (sutil::is_key(*it))buf.push_back(*it);
                else {
                    --it;
                    state = 3;
                }
                break;
            }
            case 3: {
                Token t(m.line, m.column, Token::ANNOTATION, buf);
                tokens.push_back(t);
                symbols.insert(Symbol(t.type, t.name));
                return true;
            }
        }
        ++it;
    }
    return false;
}